

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modifiers.hpp
# Opt level: O0

void __thiscall
pstore::command_line::details::values::
apply<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>>
          (values *this,opt<endian,_pstore::command_line::parser<endian,_void>_> *o)

{
  bool bVar1;
  parser_base *this_00;
  value_type *name;
  literal *v;
  const_iterator __end4;
  const_iterator __begin4;
  small_vector<pstore::command_line::literal,_3UL> *__range4;
  parser_base *p;
  opt<endian,_pstore::command_line::parser<endian,_void>_> *o_local;
  values *this_local;
  
  this_00 = opt<endian,_pstore::command_line::parser<endian,_void>_>::get_parser(o);
  if (this_00 != (parser_base *)0x0) {
    __end4 = small_vector<pstore::command_line::literal,_3UL>::begin(&this->values_);
    v = (literal *)small_vector<pstore::command_line::literal,_3UL>::end(&this->values_);
    while (bVar1 = pointer_based_iterator<pstore::command_line::literal_const>::operator!=
                             ((pointer_based_iterator<pstore::command_line::literal_const> *)&__end4
                              ,(pointer_based_iterator<const_pstore::command_line::literal> *)&v),
          bVar1) {
      name = pointer_based_iterator<const_pstore::command_line::literal>::operator*(&__end4);
      parser_base::add_literal_option(this_00,&name->name,name->value,&name->description);
      pointer_based_iterator<const_pstore::command_line::literal>::operator++(&__end4);
    }
  }
  return;
}

Assistant:

void apply (Opt & o) const {
                    if (parser_base * const p = o.get_parser ()) {
                        for (auto const & v : values_) {
                            p->add_literal_option (v.name, v.value, v.description);
                        }
                    }
                }